

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_insert_multiple(planck_unit_test_t *tc)

{
  int local_84;
  int local_80;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  bhdct_setup(tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)local_78,
              ion_fill_none);
  for (local_7c = 0x32; local_7c < 0x37; local_7c = local_7c + 1) {
    local_80 = local_7c;
    local_84 = local_7c << 1;
    bhdct_insert(tc,(ion_dictionary_t *)local_78,&local_80,&local_84,'\0');
  }
  bhdct_takedown(tc,(ion_dictionary_t *)local_78);
  return;
}

Assistant:

void
test_bhdct_insert_multiple(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 50; i < 55; i++) {
		bhdct_insert(tc, &dict, IONIZE(i, int), IONIZE(i * 2, int), boolean_false);
	}

	bhdct_takedown(tc, &dict);
}